

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sort_tree.hpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::SelectNth
          (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *this,
          SubFrames *frames,idx_t n)

{
  pointer puVar1;
  size_type sVar2;
  bool bVar3;
  uint *puVar4;
  ulong uVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  uint *puVar8;
  vector<unsigned_int,_true> *this_00;
  const_reference pvVar9;
  pointer pFVar10;
  uint *puVar11;
  pointer pFVar12;
  pointer pFVar13;
  size_type __n;
  ulong uVar14;
  long lVar15;
  uint *puVar16;
  pointer puVar17;
  long lVar18;
  ulong uVar19;
  long *plVar20;
  uint *puVar21;
  ulong uVar22;
  ulong uVar23;
  size_type sVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  unsigned_long uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  pair<unsigned_long,_unsigned_long> pVar31;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> cascades;
  array<std::pair<unsigned_long,_unsigned_long>,_3UL> matches;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar19 = ((long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->tree).
                  super_vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_std::allocator<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if (uVar19 < 2) {
    uVar19 = 0;
LAB_011b35e5:
    uVar28 = 0;
    uVar5 = uVar19;
  }
  else {
    __n = uVar19 - 2;
    if (__n == 0) {
      uVar19 = 0;
    }
    else {
      uVar26 = 1;
      uVar5 = __n;
      do {
        uVar26 = uVar26 << 5;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      if (2 < __n) {
        local_78 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_98 = (undefined1  [16])0x0;
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this->tree,uVar19 - 1);
        if ((frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
            super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar24 = 0;
          do {
            pvVar7 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar24);
            puVar16 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar19 = (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                           .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)puVar16 >> 2;
            puVar8 = puVar16;
            if ((long)uVar19 < 1) {
              *(ulong *)(local_98 + sVar24 * 0x10) = 0;
            }
            else {
              puVar21 = puVar16;
              uVar5 = uVar19;
              do {
                uVar23 = uVar5 >> 1;
                uVar5 = ~uVar23 + uVar5;
                puVar11 = puVar21 + uVar23 + 1;
                if (pvVar7->start <= (ulong)puVar21[uVar23]) {
                  uVar5 = uVar23;
                  puVar11 = puVar21;
                }
                puVar21 = puVar11;
              } while (0 < (long)uVar5);
              *(ulong *)(local_98 + sVar24 * 0x10) =
                   (long)puVar21 - (long)puVar16 >> 2 & 0xffffffffffffffe0;
              do {
                uVar5 = uVar19 >> 1;
                uVar19 = ~uVar5 + uVar19;
                puVar21 = puVar8 + uVar5 + 1;
                if (pvVar7->end <= (ulong)puVar8[uVar5]) {
                  uVar19 = uVar5;
                  puVar21 = puVar8;
                }
                puVar8 = puVar21;
              } while (0 < (long)uVar19);
            }
            *(ulong *)(local_98 + sVar24 * 0x10 + 8) =
                 (long)puVar8 - (long)puVar16 >> 2 & 0xffffffffffffffe0;
            sVar24 = sVar24 + 1;
          } while (sVar24 < (ulong)((long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(frames->
                                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ).
                                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
        }
        uVar19 = 0;
        uVar5 = __n;
LAB_011b3753:
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this->tree,uVar5 + 1);
        this_00 = &pvVar6->second;
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this->tree,uVar5);
        auVar30._8_4_ = 0xffffffff;
        auVar30._0_8_ = 0xffffffffffffffff;
        auVar30._12_4_ = 0xffffffff;
        puVar1 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar10 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pFVar13 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        do {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          if (pFVar13 == pFVar10) {
            uVar23 = 0;
            uVar27 = 0;
            pFVar13 = pFVar10;
          }
          else {
            uVar27 = 0;
            sVar24 = 0;
            do {
              pvVar7 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar24);
              lVar15 = sVar24 * 0x10;
              sVar2 = *(size_type *)(local_98 + lVar15);
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2);
              uVar14 = (ulong)*pvVar9;
              puVar17 = puVar1 + uVar14;
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2 + 0x20);
              uVar23 = *pvVar9 - uVar14;
              if (uVar23 != 0 && uVar14 <= *pvVar9) {
                do {
                  uVar14 = uVar23 >> 1;
                  uVar22 = ~uVar14 + uVar23;
                  uVar23 = uVar14;
                  if ((ulong)(puVar17 + uVar14 + 1)[0xffffffffffffffff] < pvVar7->start) {
                    puVar17 = puVar17 + uVar14 + 1;
                    uVar23 = uVar22;
                  }
                } while (0 < (long)uVar23);
              }
              lVar25 = (long)puVar17 - (long)puVar1 >> 2;
              *(long *)(local_68 + lVar15) = lVar25;
              sVar2 = *(size_type *)(local_98 + lVar15 + 8);
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2);
              uVar14 = (ulong)*pvVar9;
              puVar17 = puVar1 + uVar14;
              pvVar9 = vector<unsigned_int,_true>::operator[](this_00,sVar2 + 0x20);
              uVar23 = *pvVar9 - uVar14;
              if (uVar23 != 0 && uVar14 <= *pvVar9) {
                do {
                  uVar14 = uVar23 >> 1;
                  uVar22 = ~uVar14 + uVar23;
                  uVar23 = uVar14;
                  if ((ulong)(puVar17 + uVar14 + 1)[0xffffffffffffffff] < pvVar7->end) {
                    puVar17 = puVar17 + uVar14 + 1;
                    uVar23 = uVar22;
                  }
                } while (0 < (long)uVar23);
              }
              auVar30._8_4_ = 0xffffffff;
              auVar30._0_8_ = 0xffffffffffffffff;
              auVar30._12_4_ = 0xffffffff;
              lVar18 = (long)puVar17 - (long)puVar1 >> 2;
              *(long *)(local_68 + lVar15 + 8) = lVar18;
              uVar27 = (uVar27 - lVar25) + lVar18;
              sVar24 = sVar24 + 1;
              pFVar10 = (frames->
                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pFVar13 = (frames->
                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              uVar23 = (long)pFVar13 - (long)pFVar10 >> 4;
            } while (sVar24 < uVar23);
            if (n < uVar27) goto LAB_011b3995;
          }
          if (uVar23 != 0) {
            plVar20 = (long *)local_98;
            do {
              *plVar20 = *plVar20 - auVar30._0_8_;
              plVar20[1] = plVar20[1] - auVar30._8_8_;
              plVar20 = plVar20 + 2;
              uVar23 = uVar23 - 1;
            } while (uVar23 != 0);
          }
          uVar19 = uVar19 + 1;
          n = n - uVar27;
        } while( true );
      }
      uVar19 = 0;
      do {
        pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
                 ::operator[](&this->tree,__n);
        puVar16 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar26 * uVar19;
        if (puVar16 + uVar26 <
            (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pFVar13 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                    ).super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pFVar10 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                    ).super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          puVar8 = puVar16 + uVar26;
          do {
            puVar21 = puVar8;
            pFVar12 = pFVar13;
            if (pFVar10 == pFVar12) {
              uVar5 = 0;
              pFVar13 = pFVar12;
            }
            else {
              uVar5 = 0;
              sVar24 = 0;
              do {
                pvVar7 = vector<duckdb::FrameBounds,_true>::operator[](frames,sVar24);
                puVar8 = puVar16;
                if (uVar26 != 0) {
                  uVar23 = uVar26;
                  do {
                    uVar27 = uVar23 >> 1;
                    uVar23 = ~uVar27 + uVar23;
                    puVar11 = puVar8 + uVar27 + 1;
                    if (pvVar7->start <= (ulong)puVar8[uVar27]) {
                      uVar23 = uVar27;
                      puVar11 = puVar8;
                    }
                    puVar8 = puVar11;
                  } while (0 < (long)uVar23);
                }
                uVar23 = (long)puVar21 - (long)puVar8 >> 2;
                puVar11 = puVar8;
                if (0 < (long)uVar23) {
                  do {
                    uVar27 = uVar23 >> 1;
                    uVar23 = ~uVar27 + uVar23;
                    puVar4 = puVar11 + uVar27 + 1;
                    if (pvVar7->end <= (ulong)puVar11[uVar27]) {
                      uVar23 = uVar27;
                      puVar4 = puVar11;
                    }
                    puVar11 = puVar4;
                  } while (0 < (long)uVar23);
                }
                uVar5 = uVar5 + ((long)puVar11 - (long)puVar8 >> 2);
                sVar24 = sVar24 + 1;
                pFVar13 = (frames->
                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pFVar12 = (frames->
                          super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                          super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              } while (sVar24 < (ulong)((long)pFVar12 - (long)pFVar13 >> 4));
              if (n < uVar5) break;
            }
            uVar19 = uVar19 + 1;
            n = n - uVar5;
            pFVar10 = pFVar12;
            puVar8 = puVar21 + uVar26;
            puVar16 = puVar21;
          } while (puVar21 + uVar26 <
                   (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        uVar19 = uVar19 << 5;
        uVar26 = uVar26 >> 5;
        __n = __n - 1;
joined_r0x011b39f3:
      } while (__n != 0);
    }
    pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this->tree,0);
    puVar1 = (pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar28 = n + 1;
    pvVar6 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
             ::operator[](&this->tree,0);
    uVar26 = (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar6->first).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    if (uVar19 + 0x20 < uVar26) {
      uVar26 = uVar19 + 0x20;
    }
    uVar5 = uVar19;
    if (uVar19 < uVar26) {
      pFVar13 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pFVar10 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      do {
        if (pFVar13 != pFVar10) {
          uVar5 = (ulong)puVar1[uVar19];
          pFVar12 = pFVar13;
          do {
            uVar28 = uVar28 - (uVar5 < pFVar12->end && pFVar12->start <= uVar5);
            pFVar12 = pFVar12 + 1;
          } while (pFVar12 != pFVar10);
        }
        if (uVar28 == 0) goto LAB_011b35e5;
        uVar19 = uVar19 + 1;
        uVar5 = uVar26;
      } while (uVar19 != uVar26);
    }
  }
  pVar31.second = uVar28;
  pVar31.first = uVar5;
  return pVar31;
LAB_011b3995:
  if (pFVar13 != pFVar10) {
    auVar29._8_4_ = (int)uVar19;
    auVar29._0_8_ = uVar19;
    auVar29._12_4_ = (int)(uVar19 >> 0x20);
    lVar15 = 0;
    do {
      uVar27 = *(ulong *)(local_68 + lVar15 + 8);
      *(ulong *)(local_98 + lVar15) =
           (*(ulong *)(local_68 + lVar15) & 0xffffffffffffffe0) + uVar19 * 0x40;
      *(ulong *)(local_98 + lVar15 + 8) = (uVar27 & 0xffffffffffffffe0) + auVar29._8_8_ * 0x40;
      lVar15 = lVar15 + 0x10;
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  uVar19 = uVar19 << 5;
  uVar26 = uVar26 >> 5;
  __n = uVar5 - 1;
  bVar3 = uVar5 < 3;
  uVar5 = __n;
  if (bVar3) goto joined_r0x011b39f3;
  goto LAB_011b3753;
}

Assistant:

pair<idx_t, idx_t> MergeSortTree<E, O, CMP, F, C>::SelectNth(const SubFrames &frames, idx_t n) const {
	// Handle special case of a one-element tree
	if (tree.size() < 2) {
		return {0, 0};
	}

	// 	The first level contains a single run,
	//	so the only thing we need is any cascading pointers
	auto level_no = tree.size() - 2;
	idx_t level_width = 1;
	for (idx_t i = 0; i < level_no; ++i) {
		level_width *= FANOUT;
	}

	// Find Nth element in a top-down traversal
	idx_t result = 0;

	// First, handle levels with cascading pointers
	const auto min_cascaded = LowestCascadingLevel();
	if (level_no > min_cascaded) {
		//	Initialise the cascade indicies from the previous level
		using CascadeRange = pair<idx_t, idx_t>;
		std::array<CascadeRange, 3> cascades;
		const auto &level = tree[level_no + 1].first;
		for (idx_t f = 0; f < frames.size(); ++f) {
			const auto &frame = frames[f];
			auto &cascade_idx = cascades[f];
			const auto lower_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.start) - level.begin());
			cascade_idx.first = lower_idx / CASCADING * FANOUT;
			const auto upper_idx =
			    UnsafeNumericCast<idx_t>(std::lower_bound(level.begin(), level.end(), frame.end) - level.begin());
			cascade_idx.second = upper_idx / CASCADING * FANOUT;
		}

		// 	Walk the cascaded levels
		for (; level_no >= min_cascaded; --level_no) {
			//	The cascade indicies into this level are in the previous level
			const auto &level_cascades = tree[level_no + 1].second;

			// Go over all children until we found enough in range
			const auto *level_data = tree[level_no].first.data();
			while (true) {
				idx_t matched = 0;
				std::array<CascadeRange, 3> matches;
				for (idx_t f = 0; f < frames.size(); ++f) {
					const auto &frame = frames[f];
					auto &cascade_idx = cascades[f];
					auto &match = matches[f];

					const auto lower_begin = level_data + level_cascades[cascade_idx.first];
					const auto lower_end = level_data + level_cascades[cascade_idx.first + FANOUT];
					match.first =
					    UnsafeNumericCast<idx_t>(std::lower_bound(lower_begin, lower_end, frame.start) - level_data);

					const auto upper_begin = level_data + level_cascades[cascade_idx.second];
					const auto upper_end = level_data + level_cascades[cascade_idx.second + FANOUT];
					match.second =
					    UnsafeNumericCast<idx_t>(std::lower_bound(upper_begin, upper_end, frame.end) - level_data);

					matched += idx_t(match.second - match.first);
				}
				if (matched > n) {
					// 	Too much in this level, so move down to leftmost child candidate within the cascade range
					for (idx_t f = 0; f < frames.size(); ++f) {
						auto &cascade_idx = cascades[f];
						auto &match = matches[f];
						cascade_idx.first = (match.first / CASCADING + 2 * result) * FANOUT;
						cascade_idx.second = (match.second / CASCADING + 2 * result) * FANOUT;
					}
					break;
				}

				//	Not enough in this child, so move right
				for (idx_t f = 0; f < frames.size(); ++f) {
					auto &cascade_idx = cascades[f];
					++cascade_idx.first;
					++cascade_idx.second;
				}
				++result;
				n -= matched;
			}
			result *= FANOUT;
			level_width /= FANOUT;
		}
	}

	//	Continue with the uncascaded levels (except the first)
	for (; level_no > 0; --level_no) {
		const auto &level = tree[level_no].first;
		auto range_begin = level.begin() + UnsafeNumericCast<int64_t>(result * level_width);
		auto range_end = range_begin + UnsafeNumericCast<int64_t>(level_width);
		while (range_end < level.end()) {
			idx_t matched = 0;
			for (idx_t f = 0; f < frames.size(); ++f) {
				const auto &frame = frames[f];
				const auto lower_match = std::lower_bound(range_begin, range_end, frame.start);
				const auto upper_match = std::lower_bound(lower_match, range_end, frame.end);
				matched += idx_t(upper_match - lower_match);
			}
			if (matched > n) {
				// 	Too much in this level, so move down to leftmost child candidate
				//	Since we have no cascade pointers left, this is just the start of the next level.
				break;
			}
			//	Not enough in this child, so move right
			range_begin = range_end;
			range_end += UnsafeNumericCast<int64_t>(level_width);
			++result;
			n -= matched;
		}
		result *= FANOUT;
		level_width /= FANOUT;
	}

	// The last level
	const auto *level_data = tree[level_no].first.data();
	++n;

	const auto count = tree[level_no].first.size();
	for (const auto limit = MinValue<idx_t>(result + FANOUT, count); result < limit; ++result) {
		const auto v = level_data[result];
		for (const auto &frame : frames) {
			n -= (v >= frame.start) && (v < frame.end);
		}
		if (!n) {
			break;
		}
	}

	return {result, n};
}